

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-parse.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  **this;
  unsigned_long *ctx;
  char **__last;
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  socklen_t __len;
  ostream *poVar2;
  size_type sVar3;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  reference pvVar4;
  char **__first;
  sockaddr *__addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  attributes local_210;
  anon_class_24_3_e922f0ab_for_function_ local_200;
  undefined1 local_1e8 [8];
  Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  c;
  undefined1 local_190 [8];
  socket_t socket;
  endpoint end_point;
  unsigned_short port;
  address ip_address;
  io_context io_service;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_db;
  undefined1 local_da;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd_items;
  is_any_ofF<char> local_80;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dst_parts;
  allocator local_39;
  undefined1 local_38 [8];
  string address;
  char **argv_local;
  int argc_local;
  
  address.field_2._8_8_ = argv;
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage : ");
    poVar2 = std::operator<<(poVar2,*(char **)address.field_2._8_8_);
    std::operator<<(poVar2," ip:port channel1 channel2 ...\n");
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    boost::algorithm::is_any_of<char[2]>(&local_80,(char (*) [2])":");
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               &local_80,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_80);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
    if (sVar3 == 2) {
      local_da = 1;
      local_d8 = &local_d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"subscribe",&local_d9);
      local_da = 0;
      local_b0 = &local_d0;
      local_a8 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_db);
      __l._M_len = local_a8;
      __l._M_array = local_b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0,__l,&local_db);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_db);
      local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
      do {
        local_250 = local_250 + -1;
        std::__cxx11::string::~string((string *)local_250);
      } while (local_250 != &local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      __first = (char **)(address.field_2._8_8_ + 0x10);
      __last = (char **)(address.field_2._8_8_ + (long)argc * 8);
      __result = std::
                 back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_a0);
      std::
      copy<char**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (__first,__last,__result);
      boost::asio::io_context::io_context((io_context *)&ip_address.ipv6_address_.scope_id_);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,0);
      boost::asio::ip::make_address((address *)((long)&end_point.impl_.data_ + 0x18),pvVar4);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,1);
      end_point.impl_.data_._22_2_ =
           boost::lexical_cast<unsigned_short,std::__cxx11::string>(pvVar4);
      poVar2 = std::operator<<((ostream *)&std::cout,"connecting to ");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      std::operator<<(poVar2,"\n");
      this = &socket.
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)this,
                 (address *)((long)&end_point.impl_.data_ + 0x18),end_point.impl_.data_._22_2_);
      c.stream_.
      super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      .impl_.executor_.prop_fns_._4_4_ =
           boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::protocol
                     ((basic_endpoint<boost::asio::ip::tcp> *)this);
      __len = 0;
      boost::asio::
      basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::basic_stream_socket<boost::asio::io_context>
                ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)local_190,(io_context *)&ip_address.ipv6_address_.scope_id_,
                 (protocol_type *)
                 ((long)&c.stream_.
                         super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                         .impl_.executor_.prop_fns_ + 4),(type *)0x0);
      boost::asio::
      basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::connect((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)local_190,(int)&socket + 0x48,__addr,__len);
      std::operator<<((ostream *)&std::cout,"connected\n");
      bredis::
      Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
      ::
      Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                ((Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                  *)local_1e8,
                 (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)local_190);
      local_200.cmd_items =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a0;
      local_200.c = (Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                     *)local_1e8;
      ctx = &ip_address.ipv6_address_.scope_id_;
      local_200.io_service = (io_context *)ctx;
      boost::coroutines::attributes::attributes(&local_210);
      boost::asio::spawn<main::__0,boost::asio::io_context>
                ((io_context *)ctx,&local_200,&local_210,(type *)0x0);
      boost::asio::io_context::run((io_context *)&ip_address.ipv6_address_.scope_id_);
      poVar2 = std::operator<<((ostream *)&std::cout,"exiting...");
      std::operator<<(poVar2,"\n");
      argv_local._4_4_ = 0;
      cmd_items.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      bredis::
      Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
      ::~Connection((Connection<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                     *)local_1e8);
      boost::asio::
      basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~basic_stream_socket
                ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)local_190);
      boost::asio::io_context::~io_context((io_context *)&ip_address.ipv6_address_.scope_id_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a0);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Usage : ");
      poVar2 = std::operator<<(poVar2,*(char **)address.field_2._8_8_);
      std::operator<<(poVar2," ip:port channel1 channel2 ...\n");
      argv_local._4_4_ = 1;
      cmd_items.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    std::__cxx11::string::~string((string *)local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    // common setup
    using socket_t = asio::ip::tcp::socket;
    using next_layer_t = socket_t;
    using Buffer = boost::asio::streambuf;
    using Iterator = typename r::to_iterator<Buffer>::iterator_t;

    if (argc < 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::string address(argv[1]);
    std::vector<std::string> dst_parts;
    boost::split(dst_parts, address, boost::is_any_of(":"));
    if (dst_parts.size() != 2) {
        std::cout << "Usage : " << argv[0]
                  << " ip:port channel1 channel2 ...\n";
        return 1;
    }

    std::vector<std::string> cmd_items{"subscribe"};
    std::copy(&argv[2], &argv[argc], std::back_inserter(cmd_items));

    // connect to redis
    asio::io_context io_service;
    auto ip_address = asio::ip::make_address(dst_parts[0]);
    auto port = boost::lexical_cast<std::uint16_t>(dst_parts[1]);
    std::cout << "connecting to " << address << "\n";
    asio::ip::tcp::endpoint end_point(ip_address, port);
    socket_t socket(io_service, end_point.protocol());
    socket.connect(end_point);
    std::cout << "connected\n";

    // wrap socket into bredis connection
    r::Connection<next_layer_t> c(std::move(socket));

    // let's have it synchronous-like sexy syntax
    boost::asio::spawn(io_service, [&](boost::asio::yield_context
                                           yield) mutable {
        boost::system::error_code error_code;

        // this is rx_and tx_buff simultaneously. Usually,
        // you should NOT do that, i.e. in case of pipe-lining
        Buffer buff;

        // write subscription command
        r::single_command_t subscribe_cmd{cmd_items.cbegin(), cmd_items.cend()};
        auto consumed = c.async_write(buff, subscribe_cmd, yield[error_code]);

        if (error_code) {
            std::cout << "subscription error :: " << error_code.message()
                      << "\n";
            io_service.stop();
        }
        std::cout << "send subscription\n";
        buff.consume(consumed);

        // check subscription
        {
            r::marker_helpers::check_subscription<Iterator> check_subscription{
                std::move(subscribe_cmd)};

            for (auto it = cmd_items.cbegin() + 1; it != cmd_items.cend();
                 it++) {
                auto parse_result = c.async_read(buff, yield[error_code], 1);
                std::cout << "received something...\n";
                if (error_code) {
                    std::cout
                        << "reading result error :: " << error_code.message()
                        << "\n";
                    io_service.stop();
                    return;
                }

                bool confimed = boost::apply_visitor(check_subscription,
                                                     parse_result.result);
                if (!confimed) {
                    std::cout << "subscription was not confirmed\n";
                    io_service.stop();
                    return;
                }
                buff.consume(parse_result.consumed);
            }
            std::cout << "subscription(s) has been confirmed\n";
        }

        while (true) {
            // read the reply
            auto parse_result = c.async_read(buff, yield[error_code], 1);
            std::cout << "received something...\n";
            if (error_code) {
                std::cout << "reading result error :: " << error_code.message()
                          << "\n";
                break;
            }
            // extract the JSON from message payload

            json_extractor<Iterator> extract;
            auto payload = boost::apply_visitor(extract, parse_result.result);

            if (payload) {
                std::cout << "on channel '" << payload.get().channel
                          << "' got json :: " << payload.get().json.serialize()
                          << "\n";
            } else {
                std::cout << "wasn't able to parse payload as json\n";
            }

            buff.consume(parse_result.consumed);
        }
        io_service.stop();

    });

    io_service.run();
    std::cout << "exiting..."
              << "\n";
    return 0;
}